

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

char * bcf_hdr_fmt_text(bcf_hdr_t *hdr,int is_bcf,int *len)

{
  long lVar1;
  kstring_t txt;
  kstring_t local_48;
  
  local_48.l = 0;
  local_48.m = 0;
  local_48.s = (char *)0x0;
  if (0 < hdr->nhrec) {
    lVar1 = 0;
    do {
      _bcf_hrec_format(hdr->hrec[lVar1],is_bcf,&local_48);
      lVar1 = lVar1 + 1;
    } while (lVar1 < hdr->nhrec);
  }
  ksprintf(&local_48,"#CHROM\tPOS\tID\tREF\tALT\tQUAL\tFILTER\tINFO");
  if (hdr->n[2] != 0) {
    ksprintf(&local_48,"\tFORMAT");
    if (0 < hdr->n[2]) {
      lVar1 = 0;
      do {
        ksprintf(&local_48,"\t%s",hdr->samples[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < hdr->n[2]);
    }
  }
  ksprintf(&local_48,"\n");
  if (len != (int *)0x0) {
    *len = (int)local_48.l;
  }
  return local_48.s;
}

Assistant:

char *bcf_hdr_fmt_text(const bcf_hdr_t *hdr, int is_bcf, int *len)
{
    int i;
    kstring_t txt = {0,0,0};
    for (i=0; i<hdr->nhrec; i++)
        _bcf_hrec_format(hdr->hrec[i], is_bcf, &txt);

    ksprintf(&txt,"#CHROM\tPOS\tID\tREF\tALT\tQUAL\tFILTER\tINFO");
    if ( bcf_hdr_nsamples(hdr) )
    {
        ksprintf(&txt,"\tFORMAT");
        for (i=0; i<bcf_hdr_nsamples(hdr); i++)
            ksprintf(&txt,"\t%s", hdr->samples[i]);
    }
    ksprintf(&txt,"\n");

    if ( len ) *len = txt.l;
    return txt.s;
}